

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher_list<int_&(int_&)>::decommission(call_matcher_list<int_&(int_&)> *this)

{
  bool bVar1;
  call_matcher_base<int_&(int_&)> *this_00;
  iterator *rh;
  call_matcher_base<int_&(int_&)> *m;
  iterator e;
  iterator iter;
  unique_lock<std::recursive_mutex> lock;
  call_matcher_list<int_&(int_&)> *this_local;
  
  get_lock<void>();
  e = list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>::begin
                (&this->
                  super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>
                );
  m = (call_matcher_base<int_&(int_&)> *)
      list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>::end
                (&this->
                  super_list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>
                );
  while( true ) {
    rh = (iterator *)&m;
    bVar1 = trompeloeil::operator!=(&e,rh);
    if (!bVar1) break;
    this_00 = list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>::
              iterator::operator*(&e);
    list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>::iterator::
    operator++(&e);
    (*(this_00->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>)._vptr_list_elem[2])
              ();
    list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>::unlink
              (&this_00->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>,(char *)rh);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&iter);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }